

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# link.hpp
# Opt level: O2

void __thiscall
libtorrent::aux::link::unlink<libtorrent::aux::torrent>
          (link *this,vector<libtorrent::aux::torrent_*> *list,torrent_list_index_t link_index)

{
  int iVar1;
  pointer pptVar2;
  torrent *ptVar3;
  int s;
  
  iVar1 = this->index;
  if (iVar1 != -1) {
    pptVar2 = (list->
              super_vector<libtorrent::aux::torrent_*,_std::allocator<libtorrent::aux::torrent_*>_>)
              .
              super__Vector_base<libtorrent::aux::torrent_*,_std::allocator<libtorrent::aux::torrent_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    s = (int)((ulong)((long)(list->
                            super_vector<libtorrent::aux::torrent_*,_std::allocator<libtorrent::aux::torrent_*>_>
                            ).
                            super__Vector_base<libtorrent::aux::torrent_*,_std::allocator<libtorrent::aux::torrent_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)pptVar2) >> 3) + -1;
    if (iVar1 < s) {
      ptVar3 = pptVar2[s];
      *(int *)((long)(&ptVar3->m_info_hash + 1) + (long)link_index.m_val * 4) = iVar1;
      pptVar2[this->index] = ptVar3;
    }
    container_wrapper<libtorrent::aux::torrent*,int,std::vector<libtorrent::aux::torrent*,std::allocator<libtorrent::aux::torrent*>>>
    ::resize<int,void>((container_wrapper<libtorrent::aux::torrent*,int,std::vector<libtorrent::aux::torrent*,std::allocator<libtorrent::aux::torrent*>>>
                        *)list,s);
    this->index = -1;
  }
  return;
}

Assistant:

void unlink(aux::vector<T*>& list
			, torrent_list_index_t const link_index)
		{
			if (index == -1) return;
			TORRENT_ASSERT(index >= 0 && index < int(list.size()));
			int const last = int(list.size()) - 1;
			if (index < last)
			{
				list[last]->m_links[link_index].index = index;
				list[index] = list[last];
			}
			list.resize(last);
			index = -1;
		}